

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tokenizer-0.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  FILE *__stream;
  pointer pbVar2;
  _Alloc_hider _Var3;
  uint uVar4;
  istream *piVar5;
  pointer piVar6;
  mapped_type *this;
  long lVar7;
  ostream *poVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  llama_model_params *plVar12;
  llama_context_params *plVar13;
  char *pcVar14;
  undefined8 *puVar15;
  ulong uVar16;
  int *tok;
  ulong uVar17;
  pointer piVar18;
  bool bVar19;
  byte bVar20;
  undefined8 auStack_678 [15];
  bool success;
  vector<int,_std::allocator<int>_> res;
  llama_context *ctx;
  int local_5bc;
  string sraw;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  llama_tests k_tests;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sinp;
  string fname_text;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sout;
  string fname;
  vector<int,_std::allocator<int>_> toks;
  string fname_out;
  string fname_inp;
  string stok;
  llama_context_params cparams;
  undefined8 auStack_358 [36];
  llama_model_params mparams;
  
  bVar20 = 0;
  if (argc < 2) {
    fprintf(_stderr,"Usage: %s vocab-file [text-file]\n",*argv);
    return 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fname,argv[1],(allocator<char> *)&cparams);
  std::operator+(&fname_inp,&fname,".inp");
  std::operator+(&fname_out,&fname,".out");
  fname_text._M_dataplus._M_p = (pointer)&fname_text.field_2;
  fname_text._M_string_length = 0;
  fname_text.field_2._M_local_buf[0] = '\0';
  if (argc != 2) {
    std::__cxx11::string::assign((char *)&fname_text);
  }
  fprintf(_stderr,"%s : reading vocab from: \'%s\'\n","main",fname._M_dataplus._M_p);
  llama_backend_init();
  llama_model_default_params(&mparams);
  _Var3 = fname._M_dataplus;
  mparams.vocab_only = true;
  plVar12 = &mparams;
  puVar15 = auStack_678;
  for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar15 = plVar12->devices;
    plVar12 = (llama_model_params *)((long)plVar12 + (ulong)bVar20 * -0x10 + 8);
    puVar15 = puVar15 + (ulong)bVar20 * -2 + 1;
  }
  lVar9 = llama_model_load_from_file(_Var3._M_p);
  if (lVar9 == 0) {
    fprintf(_stderr,"%s: error: failed to load vocab \'%s\'\n","main",fname._M_dataplus._M_p);
  }
  else {
    llama_context_default_params(&cparams);
    plVar13 = &cparams;
    puVar15 = auStack_678;
    for (lVar10 = 0xf; lVar10 != 0; lVar10 = lVar10 + -1) {
      *puVar15 = *(undefined8 *)plVar13;
      plVar13 = (llama_context_params *)((long)plVar13 + (ulong)bVar20 * -0x10 + 8);
      puVar15 = puVar15 + (ulong)bVar20 * -2 + 1;
    }
    ctx = (llama_context *)llama_init_from_model(lVar9);
    if (ctx != (llama_context *)0x0) {
      success = true;
      k_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &k_tests._M_t._M_impl.super__Rb_tree_header._M_header;
      k_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           k_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (fname_text._M_string_length == 0) {
        k_tests._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             k_tests._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        k_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        k_tests._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        std::ifstream::ifstream(&cparams,(string *)&fname_inp,_S_in);
        if ((*(byte *)((long)&cparams.attention_type + *(long *)(cparams._0_8_ + -0x18)) & 5) == 0)
        {
          sraw._M_dataplus._M_p = (pointer)&sraw.field_2;
          std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
                    ((string *)&sraw,
                     *(undefined8 *)((long)auStack_358 + *(long *)(cparams._0_8_ + -0x18)),
                     0xffffffffffffffff,0);
          std::ifstream::ifstream(&mparams,(string *)&fname_out,_S_in);
          if (((byte)*(ggml_backend_dev_t)((long)&mparams.tensor_split + (long)mparams.devices[-3])
              & 5) == 0) {
            sout.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
            threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            sout.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            sout.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
            while (piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                      ((istream *)&mparams,(string *)&threads),
                  ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&sout,(value_type *)&threads);
            }
            std::__cxx11::string::~string((string *)&threads);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&threads,"\n__ggml_vocab_test__\n",(allocator<char> *)&res);
            sinp.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            sinp.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            sinp.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            uVar16 = 0;
            while (uVar16 < sraw._M_string_length) {
              lVar10 = std::__cxx11::string::find((string *)&sraw,(ulong)&threads);
              if (lVar10 == -1) {
                std::__cxx11::string::substr((ulong)&res,(ulong)&sraw);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &sinp,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&res);
                std::__cxx11::string::~string((string *)&res);
                break;
              }
              std::__cxx11::string::substr((ulong)&res,(ulong)&sraw);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&sinp,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res);
              std::__cxx11::string::~string((string *)&res);
              uVar16 = (long)&((threads.
                                super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                _M_impl.super__Vector_impl_data._M_finish)->_M_id)._M_thread +
                       lVar10;
            }
            if ((long)sinp.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)sinp.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start ==
                (long)sout.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)sout.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
              for (uVar16 = 0;
                  pbVar2 = sinp.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                  uVar16 < (ulong)((long)sinp.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)sinp.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5);
                  uVar16 = uVar16 + 1) {
                string_strip((string *)&res,
                             sout.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar16);
                toks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start = (pointer)0x0;
                toks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish = (pointer)0x0;
                toks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage = (pointer)0x0;
                for (piVar6 = (pointer)0x0;
                    piVar6 < res.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish; piVar6 = (pointer)((long)piVar6 + 1)
                    ) {
                  piVar6 = (pointer)std::__cxx11::string::find((char)(string *)&res,0x20);
                  if (piVar6 == (pointer)0xffffffffffffffff) {
                    piVar6 = res.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish;
                  }
                  std::__cxx11::string::substr((ulong)&stok,(ulong)&res);
                  local_5bc = std::__cxx11::stoi(&stok,(size_t *)0x0,10);
                  std::vector<int,_std::allocator<int>_>::emplace_back<int>
                            ((vector<int,_std::allocator<int>_> *)
                             &toks.super__Vector_base<int,_std::allocator<int>_>,&local_5bc);
                  std::__cxx11::string::~string((string *)&stok);
                }
                this = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ::operator[](&k_tests,pbVar2 + uVar16);
                std::vector<int,_std::allocator<int>_>::operator=
                          (this,(vector<int,_std::allocator<int>_> *)
                                &toks.super__Vector_base<int,_std::allocator<int>_>);
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                          (&toks.super__Vector_base<int,_std::allocator<int>_>);
                std::__cxx11::string::~string((string *)&res);
              }
            }
            else {
              fprintf(_stderr,"%s : error: input and output files have different number of tests\n",
                      "read_tests");
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&sinp);
            std::__cxx11::string::~string((string *)&threads);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&sout);
          }
          else {
            fprintf(_stderr,"%s : error: could not open file \'%s\'\n","read_tests",
                    fname_out._M_dataplus._M_p);
          }
          std::ifstream::~ifstream(&mparams);
          std::__cxx11::string::~string((string *)&sraw);
        }
        else {
          fprintf(_stderr,"%s : error: could not open file \'%s\'\n","read_tests",
                  fname_inp._M_dataplus._M_p);
        }
        std::ifstream::~ifstream(&cparams);
        if (k_tests._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
          fprintf(_stderr,"%s : error: no tests found\n","operator()");
          exit(1);
        }
      }
      else {
        k_tests._M_t._M_impl._0_8_ = 0;
        k_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        k_tests._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        k_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        k_tests._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      }
      uVar4 = std::thread::hardware_concurrency();
      std::vector<std::thread,_std::allocator<std::thread>_>::vector
                (&threads,(long)(int)uVar4,(allocator_type *)&cparams);
      uVar11 = 0;
      uVar16 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar16 = uVar11;
      }
      for (uVar17 = 0; uVar16 != uVar17; uVar17 = uVar17 + 1) {
        mparams.devices = (ggml_backend_dev_t *)0x0;
        cparams._0_8_ = operator_new(0x28);
        *(undefined ***)cparams._0_8_ = &PTR___State_00144940;
        *(int *)(cparams._0_8_ + 8) = (int)uVar17;
        *(llama_tests **)(cparams._0_8_ + 0x10) = &k_tests;
        *(llama_context ***)(cparams._0_8_ + 0x18) = &ctx;
        *(bool **)(cparams._0_8_ + 0x20) = &success;
        std::thread::_M_start_thread(&mparams,&cparams,0);
        if (cparams._0_8_ != 0) {
          (**(code **)(*(long *)cparams._0_8_ + 8))();
        }
        std::thread::operator=
                  ((thread *)
                   ((long)&((threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                             _M_impl.super__Vector_impl_data._M_start)->_M_id)._M_thread + uVar11),
                   (thread *)&mparams);
        std::thread::~thread((thread *)&mparams);
        uVar11 = uVar11 + 8;
      }
      for (lVar10 = 0; uVar16 * 8 != lVar10; lVar10 = lVar10 + 8) {
        std::thread::join();
      }
      if (fname_text._M_string_length == 0) {
LAB_0011f526:
        llama_model_free(lVar9);
        llama_free(ctx);
        llama_backend_free();
        putchar(10);
        pcVar14 = "failed";
        if (success != false) {
          pcVar14 = "passed";
        }
        printf("Tests %s\n",pcVar14);
        uVar4 = (success ^ 1) * 3;
      }
      else {
        fprintf(_stderr,"%s : tokenizing: \'%s\'\n","main",fname_text._M_dataplus._M_p);
        mparams.devices = (ggml_backend_dev_t *)&mparams.n_gpu_layers;
        mparams.tensor_buft_overrides = (llama_model_tensor_buft_override *)0x0;
        mparams.n_gpu_layers._0_1_ = 0;
        std::ifstream::ifstream(&cparams,(string *)&fname_text,_S_in);
        uVar1 = *(uint *)((long)&cparams.attention_type + *(long *)(cparams._0_8_ + -0x18));
        bVar19 = (uVar1 & 5) != 0;
        if (bVar19) {
          fprintf(_stderr,"%s : error: could not open file \'%s\'\n","main",
                  fname_text._M_dataplus._M_p);
        }
        else {
          sraw._M_dataplus._M_p = (pointer)&sraw.field_2;
          std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
                    ((string *)&sraw,
                     *(undefined8 *)((long)auStack_358 + *(long *)(cparams._0_8_ + -0x18)),
                     0xffffffffffffffff,0);
          std::__cxx11::string::operator=((string *)&mparams,(string *)&sraw);
          std::__cxx11::string::~string((string *)&sraw);
        }
        uVar4 = (uint)bVar19;
        std::ifstream::~ifstream(&cparams);
        if ((uVar1 & 5) == 0) {
          fprintf(_stderr,"%s : text size: %zu\n","main");
          res.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
               = (pointer)0x0;
          res.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          res.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          lVar10 = ggml_time_us();
          common_tokenize((vector<int,_std::allocator<int>_> *)&cparams,ctx,(string *)&mparams,false
                          ,false);
          std::vector<int,_std::allocator<int>_>::_M_move_assign(&res,&cparams);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&cparams);
          lVar7 = ggml_time_us();
          fprintf(_stderr,"%s : tokenized in %.3f ms (cpp)\n",(double)(lVar7 - lVar10) / 1000.0,
                  "main");
          fprintf(_stderr,"%s : tokens: %zu\n","main",
                  (long)res.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)res.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2);
          std::operator+(&sraw,&fname_text,".tokcpp");
          std::ofstream::ofstream(&cparams,(string *)&sraw,_S_out);
          piVar6 = res.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                   ._M_finish;
          uVar1 = *(uint *)((long)&cparams.attention_type + *(long *)(cparams._0_8_ + -0x18));
          bVar19 = (uVar1 & 5) == 0;
          if (bVar19) {
            for (piVar18 = res.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start; piVar18 != piVar6;
                piVar18 = piVar18 + 1) {
              poVar8 = (ostream *)std::ostream::operator<<((ostream *)&cparams,*piVar18);
              std::operator<<(poVar8,"\n");
            }
          }
          else {
            fprintf(_stderr,"%s : error: could not open file \'%s\'\n","main",sraw._M_dataplus._M_p)
            ;
            uVar4 = 1;
          }
          std::ofstream::~ofstream(&cparams);
          std::__cxx11::string::~string((string *)&sraw);
          __stream = _stderr;
          if ((uVar1 & 5) == 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &cparams,&fname_text,".tokcpp");
            fprintf(__stream,"%s : tokens written to \'%s\'\n","main",cparams._0_8_);
            std::__cxx11::string::~string((string *)&cparams);
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&res.super__Vector_base<int,_std::allocator<int>_>);
        }
        else {
          bVar19 = false;
        }
        std::__cxx11::string::~string((string *)&mparams);
        if (bVar19) goto LAB_0011f526;
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree(&k_tests._M_t);
      goto LAB_0011f598;
    }
    fprintf(_stderr,"%s: error: failed to load vocab \'%s\'\n","main",fname._M_dataplus._M_p);
    llama_model_free(lVar9);
  }
  uVar4 = 1;
LAB_0011f598:
  std::__cxx11::string::~string((string *)&fname_text);
  std::__cxx11::string::~string((string *)&fname_out);
  std::__cxx11::string::~string((string *)&fname_inp);
  std::__cxx11::string::~string((string *)&fname);
  return uVar4;
}

Assistant:

int main(int argc, char **argv) {
    if (argc < 2) {
        fprintf(stderr, "Usage: %s vocab-file [text-file]\n", argv[0]);
        return 1;
    }

    const std::string fname = argv[1];

    const std::string fname_inp = fname + ".inp";
    const std::string fname_out = fname + ".out";

    std::string fname_text;
    if (argc > 2) {
        fname_text = argv[2];
    }

    fprintf(stderr, "%s : reading vocab from: '%s'\n", __func__, fname.c_str());

    llama_model * model;
    llama_context * ctx;

    llama_backend_init();

    // load the vocab
    {
        auto mparams = llama_model_default_params();

        mparams.vocab_only = true;

        model = llama_model_load_from_file(fname.c_str(), mparams);

        if (model == NULL) {
            fprintf(stderr, "%s: error: failed to load vocab '%s'\n", __func__, fname.c_str());
            return 1;
        }

        auto cparams = llama_context_default_params();

        ctx = llama_init_from_model(model, cparams);

        if (ctx == NULL) {
            fprintf(stderr, "%s: error: failed to load vocab '%s'\n", __func__, fname.c_str());
            llama_model_free(model);
            return 1;
        }
    }

#ifdef _WIN32
    // We need this for unicode console support
    console::init(false, false);
    atexit([]() { console::cleanup(); });
#endif

    bool success = true;

    const auto k_tests = [&]() -> llama_tests {
        if (!fname_text.empty()) {
            return {};
        }

        const auto res = read_tests(fname_inp, fname_out);

        if (res.empty()) {
            fprintf(stderr, "%s : error: no tests found\n", __func__);
            exit(1);
        }

        return res;
    }();

    const bool add_special = false;

    // multi-threaded tokenization
    const int nthread = std::thread::hardware_concurrency();
    std::vector<std::thread> threads(nthread);

    for (int i = 0; i < nthread; i++) {
        threads[i] = std::thread([&, i]() {
            for (const auto & test_kv : k_tests) {
                const std::vector<llama_token> res = common_tokenize(ctx, test_kv.first, add_special, false);

                // here only print the result of the first thread
                // because the other threads are running the same tests
                if (i != 0) {
                    continue;
                }

                printf("\n");
                printf("src: '%s'\n", test_kv.first.c_str());
                printf("res: '%s'\n", common_detokenize(ctx, res).c_str());
                printf("tok: ");
                for (const auto & tok : res) {
                    printf("%d ", tok);
                }
                printf("\n");

                bool correct = res.size() == test_kv.second.size();
                for (int i = 0; i < (int) res.size() && correct; ++i) {
                    if (test_kv.second[i] != res[i]) {
                        correct = false;
                    }
                }

                if (!correct) {
                    fprintf(stderr, "%s : failed test:    '%s'\n", __func__, test_kv.first.c_str());
                    fprintf(stderr, "%s : detokenized to: '%s' instead of '%s'\n", __func__,
                        common_detokenize(ctx, res).c_str(),
                        common_detokenize(ctx, test_kv.second).c_str());
                    fprintf(stderr, "%s : expected tokens: ", __func__);
                    for (const auto & t : test_kv.second) {
                        fprintf(stderr, "%6d '%s', ", t, common_token_to_piece(ctx, t).c_str());
                    }
                    fprintf(stderr, "\n");
                    fprintf(stderr, "%s : got tokens:      ", __func__);
                    for (const auto & t : res) {
                        fprintf(stderr, "%6d '%s', ", t, common_token_to_piece(ctx, t).c_str());
                    }
                    fprintf(stderr, "\n");

                    success = false;
                }
            }
        });
    }

    for (int i = 0; i < nthread; i++) {
        threads[i].join();
    }

    // single threaded tokenization
    if (!fname_text.empty()) {
        fprintf(stderr, "%s : tokenizing: '%s'\n", __func__, fname_text.c_str());

        std::string text;
        {
            std::ifstream ifs(fname_text);
            if (!ifs) {
                fprintf(stderr, "%s : error: could not open file '%s'\n", __func__, fname_text.c_str());
                return 1;
            }
            text = std::string(std::istreambuf_iterator<char>(ifs), std::istreambuf_iterator<char>());
        }

        fprintf(stderr, "%s : text size: %zu\n", __func__, text.size());

        std::vector<llama_token> res;

        {
            const auto t_start = ggml_time_us();

            res = common_tokenize(ctx, text, add_special, false);

            const auto t_end = ggml_time_us();

            fprintf(stderr, "%s : tokenized in %.3f ms (cpp)\n", __func__, (t_end - t_start) / 1000.0);
        }

        fprintf(stderr, "%s : tokens: %zu\n", __func__, res.size());

        {
            const std::string fname_out = fname_text + ".tokcpp";

            std::ofstream ofs(fname_out);
            if (!ofs) {
                fprintf(stderr, "%s : error: could not open file '%s'\n", __func__, fname_out.c_str());
                return 1;
            }

            for (const auto & tok : res) {
                //ofs << tok << " '" << string_strip(llama_detokenize(ctx, std::vector<int>{tok})) << "'" << std::endl;
                ofs << tok << "\n";
            }
        }

        fprintf(stderr, "%s : tokens written to '%s'\n", __func__, (fname_text + ".tokcpp").c_str());
    }

    llama_model_free(model);
    llama_free(ctx);

    llama_backend_free();

    printf("\n");
    printf("Tests %s\n", success ? "passed" : "failed");

    return success ? 0 : 3;
}